

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O2

int write_null(archive_write *a,size_t size)

{
  ulong uVar1;
  int iVar2;
  void *__s;
  ulong uVar3;
  void *__s_00;
  ulong size_00;
  
  uVar1 = *(ulong *)((long)a->format_data + 0x102e0);
  __s_00 = (void *)((long)a->format_data + (0x102dc - uVar1));
  uVar3 = size - uVar1;
  if (size < uVar1 || uVar3 == 0) {
    memset(__s_00,0,size);
    iVar2 = wb_consume(a,size);
    return iVar2;
  }
  memset(__s_00,0,uVar1);
  iVar2 = wb_consume(a,uVar1);
  if (iVar2 == 0) {
    __s = (void *)((long)a->format_data + (0x102dc - *(long *)((long)a->format_data + 0x102e0)));
    memset(__s,0,(long)__s_00 - (long)__s);
    uVar1 = *(ulong *)((long)a->format_data + 0x102e0);
    do {
      if (uVar3 == 0) {
        return 0;
      }
      size_00 = uVar1;
      if (uVar3 < uVar1) {
        size_00 = uVar3;
      }
      iVar2 = wb_consume(a,size_00);
      uVar3 = uVar3 - size_00;
    } while (iVar2 == 0);
  }
  return iVar2;
}

Assistant:

static int
write_null(struct archive_write *a, size_t size)
{
	size_t remaining;
	unsigned char *p, *old;
	int r;

	remaining = wb_remaining(a);
	p = wb_buffptr(a);
	if (size <= remaining) {
		memset(p, 0, size);
		return (wb_consume(a, size));
	}
	memset(p, 0, remaining);
	r = wb_consume(a, remaining);
	if (r != ARCHIVE_OK)
		return (r);
	size -= remaining;
	old = p;
	p = wb_buffptr(a);
	memset(p, 0, old - p);
	remaining = wb_remaining(a);
	while (size) {
		size_t wsize = size;

		if (wsize > remaining)
			wsize = remaining;
		r = wb_consume(a, wsize);
		if (r != ARCHIVE_OK)
			return (r);
		size -= wsize;
	}
	return (ARCHIVE_OK);
}